

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.cpp
# Opt level: O0

bool __thiscall
MinVR::VRDataIndex::linkNode
          (VRDataIndex *this,string *fullSourceName,string *fullTargetName,int depthLimit)

{
  bool bVar1;
  byte bVar2;
  VRCORETYPE_ID VVar3;
  int iVar4;
  undefined8 uVar5;
  char *pcVar6;
  mapped_type *this_00;
  VRDatum *pVVar7;
  undefined4 extraout_var;
  int in_ECX;
  string *in_RDX;
  VRDataIndex *in_RSI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>,_bool>
  pVar9;
  iterator jt;
  VRContainer childrenToCopy;
  iterator targetEntry;
  VRDatumPtr sourceNode;
  string fixTargetName;
  iterator sourceEntry;
  string *in_stack_fffffffffffffad8;
  VRDatum *in_stack_fffffffffffffae0;
  value_type *in_stack_fffffffffffffae8;
  undefined4 in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaf8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>
  *in_stack_fffffffffffffb00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb08;
  allocator<char> *in_stack_fffffffffffffb10;
  allocator<char> *__a;
  key_type *in_stack_fffffffffffffb18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb20;
  undefined7 in_stack_fffffffffffffb28;
  undefined1 in_stack_fffffffffffffb2f;
  string local_428 [32];
  string local_408 [32];
  string local_3e8 [32];
  string local_3c8 [32];
  _Self local_3a8;
  _Self local_3a0;
  int local_394;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_390;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_388;
  undefined1 local_36a;
  undefined1 in_stack_fffffffffffffca7;
  string *in_stack_fffffffffffffca8;
  string *in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcbc;
  string *in_stack_fffffffffffffce8;
  int *in_stack_fffffffffffffcf0;
  string *in_stack_fffffffffffffcf8;
  string *in_stack_fffffffffffffd00;
  string *in_stack_fffffffffffffd08;
  VRError *in_stack_fffffffffffffd10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_299;
  allocator<char> local_271;
  string local_270 [32];
  _Base_ptr local_250;
  undefined1 local_248;
  _Self local_210;
  allocator<char> local_201;
  string local_200 [32];
  _Self local_1e0;
  VRDatumPtr local_1d8;
  string local_1c8 [38];
  undefined1 local_1a2;
  undefined4 local_180;
  _Self local_110;
  allocator<char> local_101;
  string local_100 [32];
  _Self local_e0;
  undefined1 local_d2;
  undefined4 local_b0;
  int in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  byte local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  
  if (7 < in_ECX) {
    local_d2 = 1;
    uVar5 = __cxa_allocate_exception(0xa8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10
              );
    local_b0 = 0x503;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10
              );
    VRError::VRError(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                     in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
    local_d2 = 0;
    __cxa_throw(uVar5,&VRError::typeinfo,VRError::~VRError);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  local_e0._M_node =
       (_Base_ptr)
       _getEntry((VRDataIndex *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                 in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,(bool)in_stack_fffffffffffffca7
                );
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  local_110._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
              *)in_stack_fffffffffffffad8);
  bVar1 = std::operator==(&local_e0,&local_110);
  if (bVar1) {
    local_1a2 = 1;
    uVar5 = __cxa_allocate_exception(0xa8);
    std::operator+((char *)CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28),
                   in_stack_fffffffffffffb20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10
              );
    local_180 = 0x508;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10
              );
    VRError::VRError(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                     in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
    local_1a2 = 0;
    __cxa_throw(uVar5,&VRError::typeinfo,VRError::~VRError);
  }
  pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)in_RDX);
  if (*pcVar6 == '/') {
    std::__cxx11::string::string(local_1c8,(string *)in_RDX);
  }
  else {
    std::operator+((char *)CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28),
                   in_stack_fffffffffffffb20);
  }
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>
  ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>
                *)0x142240);
  VRDatumPtr::VRDatumPtr
            ((VRDatumPtr *)in_stack_fffffffffffffae0,(VRDatumPtr *)in_stack_fffffffffffffad8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  local_1e0._M_node =
       (_Base_ptr)
       _getEntry((VRDataIndex *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                 in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,(bool)in_stack_fffffffffffffca7
                );
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator(&local_201);
  local_210._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
              *)in_stack_fffffffffffffad8);
  bVar1 = std::operator!=(&local_1e0,&local_210);
  if (bVar1) {
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>
                  *)0x14231f);
    VRDatumPtr::operator=
              ((VRDatumPtr *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
               (VRDatumPtr *)in_stack_fffffffffffffae8);
  }
  else {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_MinVR::VRDatumPtr_&,_true>
              (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
               (VRDatumPtr *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
    pVar9 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
            ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
                      *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                     in_stack_fffffffffffffae8);
    local_250 = (_Base_ptr)pVar9.first._M_node;
    local_248 = pVar9.second;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>
             *)in_stack_fffffffffffffae0);
  }
  VRDatumPtr::operator->(&local_1d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  bVar2 = VRDatum::hasAttribute(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator(&local_271);
  if ((bVar2 & 1) != 0) {
    local_36a = 1;
    pcVar6 = (char *)__cxa_allocate_exception(0xa8);
    pbVar8 = &local_299;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(pbVar8,pcVar6,in_stack_fffffffffffffb10);
    std::operator+((char *)CONCAT17(bVar2,in_stack_fffffffffffffb28),pbVar8);
    std::operator+(&in_stack_fffffffffffffae8->first,(char *)in_stack_fffffffffffffae0);
    std::operator+(&in_stack_fffffffffffffae8->first,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffae0);
    std::operator+(&in_stack_fffffffffffffae8->first,(char *)in_stack_fffffffffffffae0);
    __a = (allocator<char> *)&stack0xfffffffffffffcbf;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(pbVar8,pcVar6,__a);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(pbVar8,pcVar6,__a);
    VRError::VRError(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                     in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
    local_36a = 0;
    __cxa_throw(pcVar6,&VRError::typeinfo,VRError::~VRError);
  }
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  std::__cxx11::string::operator=((string *)this_00,local_1c8);
  pVVar7 = VRDatumPtr::operator->(&local_1d8);
  VVar3 = VRDatum::getType(pVVar7);
  if (VVar3 == VRCORETYPE_CONTAINER) {
    pVVar7 = VRDatumPtr::operator->(&local_1d8);
    iVar4 = (*pVVar7->_vptr_VRDatum[3])();
    pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(extraout_var,iVar4);
    local_390 = pbVar8;
    VRDatumConverter::operator_cast_to_list
              ((VRDatumConverter<MinVR::VRDatum> *)in_stack_fffffffffffffad8);
    bVar1 = std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&local_388);
    if (bVar1) {
      local_1 = 1;
      local_394 = 1;
    }
    else {
      local_3a0._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffad8);
      while( true ) {
        local_3a8._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffad8);
        bVar1 = std::operator!=(&local_3a0,&local_3a8);
        if (!bVar1) break;
        std::operator+(in_stack_fffffffffffffb08,(char *)this_00);
        std::
        _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*((_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x142939);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pVVar7,
                       pbVar8);
        std::operator+(in_stack_fffffffffffffb08,(char *)this_00);
        std::
        _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*((_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x14297e);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pVVar7,
                       pbVar8);
        linkNode(in_RSI,in_RDX,(string *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                 in_stack_ffffffffffffffd4);
        std::__cxx11::string::~string(local_408);
        std::__cxx11::string::~string(local_428);
        std::__cxx11::string::~string(local_3c8);
        std::__cxx11::string::~string(local_3e8);
        std::
        _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_3a0,0);
      }
      local_394 = 0;
    }
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x142acd);
    if (local_394 != 0) goto LAB_00142afe;
  }
  local_1 = 1;
  local_394 = 1;
LAB_00142afe:
  VRDatumPtr::~VRDatumPtr((VRDatumPtr *)CONCAT44(VVar3,in_stack_fffffffffffffaf0));
  std::__cxx11::string::~string(local_1c8);
  return (bool)(local_1 & 1);
}

Assistant:

bool VRDataIndex::linkNode(const std::string &fullSourceName,
                           const std::string &fullTargetName,
                           int depthLimit) {

  // This is an easy way to make a disaster, so we have a recursion
  // limit.  It's possible this should be adjustable, but not sure of
  // a use case where the plausible depthLimit would exceed 10.
  if (depthLimit > 7)
    VRERROR("Too deep a recursion.", "Did you set up a circular reference?");

  // Find source node, fail if it does not exist.
  VRDataMap::iterator sourceEntry = _getEntry(fullSourceName);
  if (sourceEntry == _theIndex.end())
    VRERRORNOADV("Can't find the source node: " + fullSourceName);

  // It's possible the target name won't start with a '/', in which
  // case, stick one on front.
  std::string fixTargetName =
    (fullTargetName[0] == '/') ? fullTargetName : "/" + fullTargetName;

  
  VRDatumPtr sourceNode = sourceEntry->second;
  VRDataMap::iterator targetEntry = _getEntry(fixTargetName);

  // Does this name already exist?
  if (targetEntry != _theIndex.end()) {

    // Yes.  Make the copy.
    targetEntry->second = sourceNode;
  } else {

    // No. Make an entry in the index, linked to the sourceNode.
    _theIndex.insert(VRDataMap::value_type(fixTargetName, sourceNode));

  }

  if (sourceNode->hasAttribute("linkContent"))
    VRERROR("Linking content and nodes not allowed.",
            "You really don't want to mix linkContent and linkNode, as in linking " +
            fullSourceName + " and " + fixTargetName + ".");

  // Record the link we made.  This is for use by the copy constructor.
  _linkRegister[fullSourceName] = fixTargetName;

  // If this is a container, recurse into the children, and copy them, too.
  if (sourceNode->getType() == VRCORETYPE_CONTAINER) {

    VRContainer childrenToCopy = sourceNode->getValue();

    // If there are no children, go home.
    if (childrenToCopy.empty()) return true;

    // Otherwise copy them, too.
    for (VRContainer::iterator jt = childrenToCopy.begin();
         jt != childrenToCopy.end(); jt++)
      linkNode(fullSourceName + "/" + *jt,
               fixTargetName + "/" + *jt,
               depthLimit + 1);
  }
  return true;
}